

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall
spirv_cross::Compiler::function_is_control_dependent(Compiler *this,SPIRFunction *func)

{
  bool bVar1;
  uint32_t id;
  SPIRBlock *block_00;
  uint32_t local_3c;
  TypedID<(spirv_cross::Types)6> *pTStack_38;
  TypedID<(spirv_cross::Types)6> block;
  TypedID<(spirv_cross::Types)6> *__end1;
  TypedID<(spirv_cross::Types)6> *__begin1;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)6>,_8UL> *__range1;
  SPIRFunction *func_local;
  Compiler *this_local;
  
  __end1 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>::begin
                     (&(func->blocks).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>
                     );
  pTStack_38 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>::end
                         (&(func->blocks).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>);
  while( true ) {
    if (__end1 == pTStack_38) {
      return false;
    }
    local_3c = __end1->id;
    id = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_3c);
    block_00 = get<spirv_cross::SPIRBlock>(this,id);
    bVar1 = block_is_control_dependent(this,block_00);
    if (bVar1) break;
    __end1 = __end1 + 1;
  }
  return true;
}

Assistant:

bool Compiler::function_is_control_dependent(const SPIRFunction &func)
{
	for (auto block : func.blocks)
		if (block_is_control_dependent(get<SPIRBlock>(block)))
			return true;

	return false;
}